

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O3

void __thiscall CStorage::AddPath(CStorage *this,char *pPath)

{
  bool bVar1;
  int iVar2;
  char *fmt;
  
  if ((this->m_NumPaths < 0x10) && (*pPath != '\0')) {
    iVar2 = str_comp(pPath,"$USERDIR");
    if (iVar2 == 0) {
      if (this->m_aUserDir[0] == '\0') {
        return;
      }
      pPath = this->m_aUserDir;
      bVar1 = IsDuplicatePath(this,pPath);
      if (bVar1) {
        fmt = "skipping duplicate path \'$USERDIR\' (\'%s\')";
      }
      else {
        iVar2 = this->m_NumPaths;
        this->m_NumPaths = iVar2 + 1;
        str_copy(this->m_aaStoragePaths[iVar2],pPath,0x200);
        fmt = "added path \'$USERDIR\' (\'%s\')";
      }
    }
    else {
      iVar2 = str_comp(pPath,"$DATADIR");
      if (iVar2 == 0) {
        if (this->m_aDataDir[0] == '\0') {
          return;
        }
        pPath = this->m_aDataDir;
        bVar1 = IsDuplicatePath(this,pPath);
        if (bVar1) {
          fmt = "skipping duplicate path \'$DATADIR\' (\'%s\')";
        }
        else {
          iVar2 = this->m_NumPaths;
          this->m_NumPaths = iVar2 + 1;
          str_copy(this->m_aaStoragePaths[iVar2],pPath,0x200);
          fmt = "added path \'$DATADIR\' (\'%s\')";
        }
      }
      else {
        iVar2 = str_comp(pPath,"$CURRENTDIR");
        if (iVar2 == 0) {
          if (this->m_aCurrentDir[0] == '\0') {
            return;
          }
          pPath = this->m_aCurrentDir;
          bVar1 = IsDuplicatePath(this,pPath);
          if (bVar1) {
            fmt = "skipping duplicate path \'$CURRENTDIR\' (\'%s\')";
          }
          else {
            iVar2 = this->m_NumPaths;
            this->m_NumPaths = iVar2 + 1;
            str_copy(this->m_aaStoragePaths[iVar2],pPath,0x200);
            fmt = "added path \'$CURRENTDIR\' (\'%s\')";
          }
        }
        else {
          iVar2 = str_comp(pPath,"$APPDIR");
          if (iVar2 == 0) {
            if (this->m_aAppDir[0] == '\0') {
              return;
            }
            pPath = this->m_aAppDir;
            bVar1 = IsDuplicatePath(this,pPath);
            if (bVar1) {
              fmt = "skipping duplicate path \'$APPDIR\' (\'%s\')";
            }
            else {
              iVar2 = this->m_NumPaths;
              this->m_NumPaths = iVar2 + 1;
              str_copy(this->m_aaStoragePaths[iVar2],pPath,0x200);
              fmt = "added path \'$APPDIR\' (\'%s\')";
            }
          }
          else {
            iVar2 = fs_is_dir(pPath);
            if (iVar2 == 0) {
              return;
            }
            bVar1 = IsDuplicatePath(this,pPath);
            if (bVar1) {
              fmt = "skipping duplicate path \'%s\'";
            }
            else {
              iVar2 = this->m_NumPaths;
              this->m_NumPaths = iVar2 + 1;
              str_copy(this->m_aaStoragePaths[iVar2],pPath,0x200);
              fmt = "added path \'%s\'";
            }
          }
        }
      }
    }
    dbg_msg("storage",fmt,pPath);
    return;
  }
  return;
}

Assistant:

void AddPath(const char *pPath)
	{
		if(m_NumPaths >= MAX_PATHS || !pPath[0])
			return;

		if(!str_comp(pPath, "$USERDIR"))
		{
			if(m_aUserDir[0])
			{
				if(!IsDuplicatePath(m_aUserDir))
				{
					str_copy(m_aaStoragePaths[m_NumPaths++], m_aUserDir, IO_MAX_PATH_LENGTH);
					dbg_msg("storage", "added path '$USERDIR' ('%s')", m_aUserDir);
				}
				else
					dbg_msg("storage", "skipping duplicate path '$USERDIR' ('%s')", m_aUserDir);
			}
		}
		else if(!str_comp(pPath, "$DATADIR"))
		{
			if(m_aDataDir[0])
			{
				if(!IsDuplicatePath(m_aDataDir))
				{
					str_copy(m_aaStoragePaths[m_NumPaths++], m_aDataDir, IO_MAX_PATH_LENGTH);
					dbg_msg("storage", "added path '$DATADIR' ('%s')", m_aDataDir);
				}
				else
					dbg_msg("storage", "skipping duplicate path '$DATADIR' ('%s')", m_aDataDir);
			}
		}
		else if(!str_comp(pPath, "$CURRENTDIR"))
		{
			if(m_aCurrentDir[0])
			{
				if(!IsDuplicatePath(m_aCurrentDir))
				{
					str_copy(m_aaStoragePaths[m_NumPaths++], m_aCurrentDir, IO_MAX_PATH_LENGTH);
					dbg_msg("storage", "added path '$CURRENTDIR' ('%s')", m_aCurrentDir);
				}
				else
					dbg_msg("storage", "skipping duplicate path '$CURRENTDIR' ('%s')", m_aCurrentDir);
			}
		}
		else if(!str_comp(pPath, "$APPDIR"))
		{
			if(m_aAppDir[0])
			{
				if(!IsDuplicatePath(m_aAppDir))
				{
					str_copy(m_aaStoragePaths[m_NumPaths++], m_aAppDir, IO_MAX_PATH_LENGTH);
					dbg_msg("storage", "added path '$APPDIR' ('%s')", m_aAppDir);
				}
				else
					dbg_msg("storage", "skipping duplicate path '$APPDIR' ('%s')", m_aAppDir);
			}
		}
		else
		{
			if(fs_is_dir(pPath))
			{
				if(!IsDuplicatePath(pPath))
				{
					str_copy(m_aaStoragePaths[m_NumPaths++], pPath, IO_MAX_PATH_LENGTH);
					dbg_msg("storage", "added path '%s'", pPath);
				}
				else
					dbg_msg("storage", "skipping duplicate path '%s'", pPath);
			}
		}
	}